

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-client.c
# Opt level: O0

void ssh2_userauth_filter_queue(ssh2_userauth_state *s)

{
  ptrlen pl;
  PktIn *pPVar1;
  size_t sVar2;
  StripCtrlChars *pSVar3;
  ptrlen pVar4;
  void *local_38;
  void *local_30;
  ptrlen string;
  PktIn *pktin;
  ssh2_userauth_state *s_local;
  
  while ((pPVar1 = (*((s->ppl).in_pq)->after)
                             (&((s->ppl).in_pq)->pqb,(PacketQueueNode *)(s->ppl).in_pq,false),
         pPVar1 != (PktIn *)0x0 && (pPVar1->type == 0x35))) {
    if ((s->show_banner & 1U) == 0) {
      (*((s->ppl).in_pq)->after)(&((s->ppl).in_pq)->pqb,(PacketQueueNode *)(s->ppl).in_pq,true);
    }
    else {
      pVar4 = BinarySource_get_string(pPVar1->binarysource_);
      local_38 = pVar4.ptr;
      local_30 = (void *)pVar4.len;
      string.ptr = local_30;
      sVar2 = bufchain_size(&s->banner);
      if ((void *)(0x20000 - sVar2) < local_30) {
        sVar2 = bufchain_size(&s->banner);
        string.ptr = (void *)(0x20000 - sVar2);
      }
      if ((s->banner_scc_initialised & 1U) == 0) {
        pSVar3 = seat_stripctrl_new((s->ppl).seat,(s->banner_bs).binarysink_,SIC_BANNER);
        s->banner_scc = pSVar3;
        if (s->banner_scc != (StripCtrlChars *)0x0) {
          stripctrl_enable_line_limiting(s->banner_scc);
        }
        s->banner_scc_initialised = true;
      }
      if (s->banner_scc == (StripCtrlChars *)0x0) {
        pVar4.len = (size_t)string.ptr;
        pVar4.ptr = local_38;
        BinarySink_put_datapl((s->banner_bs).binarysink_,pVar4);
      }
      else {
        pl.len = (size_t)string.ptr;
        pl.ptr = local_38;
        BinarySink_put_datapl(s->banner_scc->binarysink_,pl);
      }
      (*((s->ppl).in_pq)->after)(&((s->ppl).in_pq)->pqb,(PacketQueueNode *)(s->ppl).in_pq,true);
    }
  }
  return;
}

Assistant:

static void ssh2_userauth_filter_queue(struct ssh2_userauth_state *s)
{
    PktIn *pktin;
    ptrlen string;

    while ((pktin = pq_peek(s->ppl.in_pq)) != NULL) {
        switch (pktin->type) {
          case SSH2_MSG_USERAUTH_BANNER:
            if (!s->show_banner) {
                pq_pop(s->ppl.in_pq);
                break;
            }

            string = get_string(pktin);
            if (string.len > BANNER_LIMIT - bufchain_size(&s->banner))
                string.len = BANNER_LIMIT - bufchain_size(&s->banner);
            if (!s->banner_scc_initialised) {
                s->banner_scc = seat_stripctrl_new(
                    s->ppl.seat, BinarySink_UPCAST(&s->banner_bs), SIC_BANNER);
                if (s->banner_scc)
                    stripctrl_enable_line_limiting(s->banner_scc);
                s->banner_scc_initialised = true;
            }
            if (s->banner_scc)
                put_datapl(s->banner_scc, string);
            else
                put_datapl(&s->banner_bs, string);
            pq_pop(s->ppl.in_pq);
            break;

          default:
            return;
        }
    }
}